

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

int __thiscall
absl::lts_20250127::Cord::CompareSlowPath
          (Cord *this,Cord *rhs,size_t compared_size,size_t size_to_compare)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> pCVar2;
  int iVar3;
  uint uVar4;
  Nonnull<size_t_*> puVar5;
  Nonnull<size_t_*> puVar6;
  Nonnull<size_t_*> puVar7;
  int unaff_EBP;
  Nonnull<size_t_*> puVar8;
  Nonnull<size_t_*> puVar9;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  string_view rhs_chunk;
  string_view lhs_chunk;
  ChunkIterator rhs_it;
  ChunkIterator lhs_it;
  size_t local_190;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  ChunkIterator local_168;
  ChunkIterator local_c8;
  
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  local_c8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_c8.bytes_remaining_ = 0;
  local_c8.current_chunk_ = (string_view)ZEXT816(0);
  local_c8.btree_reader_.remaining_ = 0;
  local_c8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  pCVar2 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  local_190 = size_to_compare;
  if (pCVar2 == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) != 0) goto LAB_00322caf;
    local_c8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
    local_c8.current_chunk_._M_str = (char *)((long)&(this->contents_).data_.rep_.field_0 + 1);
    local_c8.current_chunk_._M_len = local_c8.bytes_remaining_;
  }
  else {
    local_c8.bytes_remaining_ = pCVar2->length;
    if ((Nonnull<size_t_*>)pCVar2->length == (Nonnull<size_t_*>)0x0) goto LAB_00322cb4;
    ChunkIterator::InitTree(&local_c8,pCVar2);
  }
  do {
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
    local_168.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
    local_168.bytes_remaining_ = 0;
    local_168.current_chunk_ = (string_view)ZEXT816(0);
    local_168.btree_reader_.remaining_ = 0;
    local_168.btree_reader_.navigator_.height_ = -1;
    bVar1 = (byte)((Nonnull<absl::string_view_*>)rhs)->_M_len;
    pCVar2 = (Nonnull<cord_internal::CordRep_*>)((Nonnull<absl::string_view_*>)rhs)->_M_str;
    if (pCVar2 == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
      if ((bVar1 & 1) == 0) {
        local_168.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
        local_168.current_chunk_._M_str =
             (char *)((long)&((Nonnull<absl::string_view_*>)rhs)->_M_len + 1);
        local_168.current_chunk_._M_len = local_168.bytes_remaining_;
      }
      else {
        CompareSlowPath();
        uVar10 = extraout_XMM0_Da_00;
        uVar11 = extraout_XMM0_Db_00;
        uVar12 = extraout_XMM0_Dc_00;
        uVar13 = extraout_XMM0_Dd_00;
LAB_00322cc6:
        local_168.current_chunk_._M_len._4_4_ = uVar11;
        local_168.current_chunk_._M_len._0_4_ = uVar10;
        local_168.current_chunk_._M_str._0_4_ = uVar12;
        local_168.current_chunk_._M_str._4_4_ = uVar13;
      }
    }
    else {
      local_168.bytes_remaining_ = pCVar2->length;
      if ((Nonnull<size_t_*>)pCVar2->length == (Nonnull<size_t_*>)0x0) goto LAB_00322cc6;
      ChunkIterator::InitTree(&local_168,pCVar2);
    }
    puVar5 = (Nonnull<size_t_*>)local_c8.bytes_remaining_;
    puVar6 = (Nonnull<size_t_*>)local_c8.bytes_remaining_;
    if ((Nonnull<size_t_*>)local_c8.bytes_remaining_ != (Nonnull<size_t_*>)0x0) {
      puVar5 = (Nonnull<size_t_*>)local_c8.current_chunk_._M_str;
      puVar6 = (Nonnull<size_t_*>)local_c8.current_chunk_._M_len;
    }
    puVar7 = (Nonnull<size_t_*>)local_168.bytes_remaining_;
    puVar8 = (Nonnull<size_t_*>)local_168.bytes_remaining_;
    if ((Nonnull<size_t_*>)local_168.bytes_remaining_ != (Nonnull<size_t_*>)0x0) {
      puVar7 = (Nonnull<size_t_*>)local_168.current_chunk_._M_str;
      puVar8 = (Nonnull<size_t_*>)local_168.current_chunk_._M_len;
    }
    if (puVar6 < compared_size) {
      __assert_fail("compared_size <= lhs_chunk.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                    ,0x3b6,"int absl::Cord::CompareSlowPath(const Cord &, size_t, size_t) const");
    }
    puVar9 = (Nonnull<size_t_*>)((long)puVar8 - compared_size);
    if (puVar8 < compared_size) {
      __assert_fail("compared_size <= rhs_chunk.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                    ,0x3b7,"int absl::Cord::CompareSlowPath(const Cord &, size_t, size_t) const");
    }
    rhs = (Cord *)&local_178;
    local_178._M_str = (char *)((long)puVar5 + compared_size);
    local_178._M_len = (size_t)((long)puVar6 - compared_size);
    local_188._M_str = (char *)((long)puVar7 + compared_size);
    local_190 = size_to_compare - compared_size;
    compared_size = (size_t)&local_190;
    local_188._M_len = (size_t)puVar9;
LAB_00322b07:
    puVar5 = (Nonnull<size_t_*>)local_c8.bytes_remaining_;
    size_to_compare = 0;
    if ((Nonnull<size_t_*>)local_178._M_len != (Nonnull<size_t_*>)0x0) {
LAB_00322bc5:
      puVar5 = (Nonnull<size_t_*>)local_168.bytes_remaining_;
      if ((Nonnull<size_t_*>)local_188._M_len == (Nonnull<size_t_*>)0x0) {
        if ((Nonnull<size_t_*>)local_168.bytes_remaining_ == (Nonnull<size_t_*>)0x0)
        goto LAB_00322caa;
        puVar6 = (Nonnull<size_t_*>)(local_168.bytes_remaining_ - local_168.current_chunk_._M_len);
        if (local_168.bytes_remaining_ < local_168.current_chunk_._M_len) {
LAB_00322cd0:
          __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                        ,0x611,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
        }
        local_168.bytes_remaining_ = (size_t)puVar6;
        if (puVar6 != (Nonnull<size_t_*>)0x0) {
          if (((long)local_168.btree_reader_.navigator_.height_ < 0) ||
             (local_168.btree_reader_.navigator_.node_[local_168.btree_reader_.navigator_.height_]
              == (CordRepBtree *)0x0)) {
            if ((Nonnull<size_t_*>)local_168.current_chunk_._M_len == (Nonnull<size_t_*>)0x0) {
LAB_00322cef:
              __assert_fail("!current_chunk_.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                            ,0x617,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
            }
            local_168.current_chunk_ = (string_view)ZEXT816(0);
            puVar5 = (Nonnull<size_t_*>)0x0;
          }
          else {
            local_168.current_chunk_ =
                 cord_internal::CordRepBtreeReader::Next(&local_168.btree_reader_);
            puVar5 = (Nonnull<size_t_*>)local_168.current_chunk_._M_len;
          }
        }
        if ((Nonnull<size_t_*>)local_168.bytes_remaining_ == (Nonnull<size_t_*>)0x0) {
          uVar4 = 1;
LAB_00322c8b:
          return (int)size_to_compare + uVar4;
        }
        local_188._M_str = local_168.current_chunk_._M_str;
        local_188._M_len = (size_t)puVar5;
      }
      iVar3 = anon_unknown_74::CompareChunks
                        ((Nonnull<absl::string_view_*>)rhs,&local_188,
                         (Nonnull<size_t_*>)compared_size);
      if (local_190 == 0) {
        unaff_EBP = 0;
      }
      if ((iVar3 != 0) || (iVar3 = unaff_EBP, local_190 == 0)) {
        return iVar3;
      }
      goto LAB_00322b07;
    }
    if ((Nonnull<size_t_*>)local_c8.bytes_remaining_ != (Nonnull<size_t_*>)0x0) {
      puVar6 = (Nonnull<size_t_*>)(local_c8.bytes_remaining_ - local_c8.current_chunk_._M_len);
      if (local_c8.bytes_remaining_ < local_c8.current_chunk_._M_len) goto LAB_00322cd0;
      local_c8.bytes_remaining_ = (size_t)puVar6;
      if (puVar6 != (Nonnull<size_t_*>)0x0) {
        if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
           (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if ((Nonnull<size_t_*>)local_c8.current_chunk_._M_len == (Nonnull<size_t_*>)0x0)
          goto LAB_00322cef;
          local_c8.current_chunk_ = (string_view)ZEXT816(0);
          puVar5 = (Nonnull<size_t_*>)0x0;
        }
        else {
          local_c8.current_chunk_ = cord_internal::CordRepBtreeReader::Next(&local_c8.btree_reader_)
          ;
          puVar5 = (Nonnull<size_t_*>)local_c8.current_chunk_._M_len;
        }
      }
      if ((Nonnull<size_t_*>)local_c8.bytes_remaining_ == (Nonnull<size_t_*>)0x0) {
        uVar4 = (uint)((Nonnull<size_t_*>)local_188._M_len == (Nonnull<size_t_*>)0x0);
        size_to_compare = 0xffffffff;
        goto LAB_00322c8b;
      }
      local_178._M_len = (size_t)puVar5;
      local_178._M_str = local_c8.current_chunk_._M_str;
      size_to_compare = (size_t)-(uint)(puVar5 == (Nonnull<size_t_*>)0x0);
      goto LAB_00322bc5;
    }
    CompareSlowPath();
LAB_00322caa:
    CompareSlowPath();
LAB_00322caf:
    CompareSlowPath();
    uVar10 = extraout_XMM0_Da;
    uVar11 = extraout_XMM0_Db;
    uVar12 = extraout_XMM0_Dc;
    uVar13 = extraout_XMM0_Dd;
LAB_00322cb4:
    local_c8.current_chunk_._M_len._4_4_ = uVar11;
    local_c8.current_chunk_._M_len._0_4_ = uVar10;
    local_c8.current_chunk_._M_str._0_4_ = uVar12;
    local_c8.current_chunk_._M_str._4_4_ = uVar13;
  } while( true );
}

Assistant:

inline int Cord::CompareSlowPath(const Cord& rhs, size_t compared_size,
                                 size_t size_to_compare) const {
  auto advance = [](absl::Nonnull<Cord::ChunkIterator*> it,
                    absl::Nonnull<absl::string_view*> chunk) {
    if (!chunk->empty()) return true;
    ++*it;
    if (it->bytes_remaining_ == 0) return false;
    *chunk = **it;
    return true;
  };

  Cord::ChunkIterator lhs_it = chunk_begin();
  Cord::ChunkIterator rhs_it = rhs.chunk_begin();

  // compared_size is inside both first chunks.
  absl::string_view lhs_chunk =
      (lhs_it.bytes_remaining_ != 0) ? *lhs_it : absl::string_view();
  absl::string_view rhs_chunk =
      (rhs_it.bytes_remaining_ != 0) ? *rhs_it : absl::string_view();
  assert(compared_size <= lhs_chunk.size());
  assert(compared_size <= rhs_chunk.size());
  lhs_chunk.remove_prefix(compared_size);
  rhs_chunk.remove_prefix(compared_size);
  size_to_compare -= compared_size;  // skip already compared size.

  while (advance(&lhs_it, &lhs_chunk) && advance(&rhs_it, &rhs_chunk)) {
    int memcmp_res = CompareChunks(&lhs_chunk, &rhs_chunk, &size_to_compare);
    if (memcmp_res != 0) return memcmp_res;
    if (size_to_compare == 0) return 0;
  }

  return static_cast<int>(rhs_chunk.empty()) -
         static_cast<int>(lhs_chunk.empty());
}